

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

int sys_flushtogui(void)

{
  int iVar1;
  ssize_t sVar2;
  int local_14;
  int nwrote;
  int writesize;
  
  iVar1 = (pd_maininstance.pd_inter)->i_guihead - (pd_maininstance.pd_inter)->i_guitail;
  local_14 = 0;
  if (0 < iVar1) {
    sVar2 = send((pd_maininstance.pd_inter)->i_guisock,
                 (pd_maininstance.pd_inter)->i_guibuf + (pd_maininstance.pd_inter)->i_guitail,
                 (long)iVar1,0);
    local_14 = (int)sVar2;
  }
  if (local_14 < 0) {
    perror("pd-to-gui socket");
    sys_bail(1);
  }
  else {
    if (local_14 == 0) {
      return 0;
    }
    if (local_14 < (pd_maininstance.pd_inter)->i_guihead - (pd_maininstance.pd_inter)->i_guitail) {
      if ((local_14 != 0) &&
         ((pd_maininstance.pd_inter)->i_guitail = local_14 + (pd_maininstance.pd_inter)->i_guitail,
         (pd_maininstance.pd_inter)->i_guisize >> 2 < (pd_maininstance.pd_inter)->i_guitail)) {
        memmove((pd_maininstance.pd_inter)->i_guibuf,
                (pd_maininstance.pd_inter)->i_guibuf + (pd_maininstance.pd_inter)->i_guitail,
                (long)((pd_maininstance.pd_inter)->i_guihead - (pd_maininstance.pd_inter)->i_guitail
                      ));
        (pd_maininstance.pd_inter)->i_guihead =
             (pd_maininstance.pd_inter)->i_guihead - (pd_maininstance.pd_inter)->i_guitail;
        (pd_maininstance.pd_inter)->i_guitail = 0;
      }
    }
    else {
      (pd_maininstance.pd_inter)->i_guitail = 0;
      (pd_maininstance.pd_inter)->i_guihead = 0;
    }
  }
  return 1;
}

Assistant:

static int sys_flushtogui(void)
{
    int writesize = INTER->i_guihead - INTER->i_guitail,
        nwrote = 0;
    if (writesize > 0)
        nwrote = (int)send(
            INTER->i_guisock,
            INTER->i_guibuf + INTER->i_guitail,
            writesize, 0);

#if 0
    if (writesize)
        fprintf(stderr, "wrote %d of %d\n", nwrote, writesize);
#endif

    if (nwrote < 0)
    {
        perror("pd-to-gui socket");
        sys_bail(1);
    }
    else if (!nwrote)
        return (0);
    else if (nwrote >= INTER->i_guihead - INTER->i_guitail)
        INTER->i_guihead = INTER->i_guitail = 0;
    else if (nwrote)
    {
        INTER->i_guitail += nwrote;
        if (INTER->i_guitail > (INTER->i_guisize >> 2))
        {
            memmove(INTER->i_guibuf,
                INTER->i_guibuf  + INTER->i_guitail,
                INTER->i_guihead - INTER->i_guitail);
            INTER->i_guihead = INTER->i_guihead - INTER->i_guitail;
            INTER->i_guitail = 0;
        }
    }
    return (1);
}